

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall
Graph<std::pair<double,_double>_>::dfsVisit
          (Graph<std::pair<double,_double>_> *this,Vertex<std::pair<double,_double>_> *v,
          vector<int,_std::allocator<int>_> *res)

{
  iterator __position;
  void *pvVar1;
  pointer ppEVar2;
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
  local_38;
  
  v->visited = true;
  local_38.
  super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = v->id;
  __position._M_current =
       (res->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (res->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(res,__position,(int *)&local_38);
  }
  else {
    *__position._M_current =
         (int)local_38.
              super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (res->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         __position._M_current + 1;
  }
  std::
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>::
  vector(&local_38,&v->outgoing);
  for (ppEVar2 = (pointer)CONCAT44(local_38.
                                   super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_38.
                                        super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
      ppEVar2 !=
      local_38.
      super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    if ((*ppEVar2)->dest->visited == false) {
      dfsVisit(this,(*ppEVar2)->dest,res);
    }
  }
  pvVar1 = (void *)CONCAT44(local_38.
                            super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_38.
                                 super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_38.
                                 super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  return;
}

Assistant:

void Graph<T>::dfsVisit(Vertex<T> *v, vector<int> &res) const {
    v->visited = true;
    res.push_back(v->getId());
    for (auto edge : v->getAdj()) {
        if (!edge->dest->visited) { dfsVisit(edge->dest, res); }
    }
}